

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineResourceSignatureDescWrapper::~PipelineResourceSignatureDescWrapper
          (PipelineResourceSignatureDescWrapper *this)

{
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->m_StringPool)._M_h);
  std::_Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ::~_Vector_base(&(this->m_ImmutableSamplers).
                   super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                 );
  std::_Vector_base<Diligent::PipelineResourceDesc,_std::allocator<Diligent::PipelineResourceDesc>_>
  ::~_Vector_base(&(this->m_Resources).
                   super__Vector_base<Diligent::PipelineResourceDesc,_std::allocator<Diligent::PipelineResourceDesc>_>
                 );
  std::__cxx11::string::~string((string *)&this->m_CombinedSamplerSuffix);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

PipelineResourceSignatureDescWrapper() = default;